

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

_Bool ssh_sftp_pw_setup(void *vctx,pollwrapper *pw)

{
  _Bool _Var1;
  int iVar2;
  int local_30;
  int local_2c;
  int rwx;
  int fdstate;
  ssh_sftp_mainloop_ctx *ctx;
  pollwrapper *pw_local;
  void *vctx_local;
  
  _rwx = (byte *)vctx;
  ctx = (ssh_sftp_mainloop_ctx *)pw;
  pw_local = (pollwrapper *)vctx;
  if ((((*(byte *)((long)vctx + 1) & 1) == 0) && (_Var1 = toplevel_callback_pending(), !_Var1)) &&
     (iVar2 = first_fd(&local_2c,&local_30), iVar2 < 0)) {
    _rwx[4] = 0xff;
    _rwx[5] = 0xff;
    _rwx[6] = 0xff;
    _rwx[7] = 0xff;
    return false;
  }
  if ((*_rwx & 1) != 0) {
    pollwrap_add_fd_rwx((pollwrapper *)ctx,0,1);
  }
  return true;
}

Assistant:

static bool ssh_sftp_pw_setup(void *vctx, pollwrapper *pw)
{
    struct ssh_sftp_mainloop_ctx *ctx = (struct ssh_sftp_mainloop_ctx *)vctx;
    int fdstate, rwx;

    if (!ctx->no_fds_ok && !toplevel_callback_pending() &&
        first_fd(&fdstate, &rwx) < 0) {
        ctx->toret = -1;
        return false; /* terminate cli_main_loop */
    }

    if (ctx->include_stdin)
        pollwrap_add_fd_rwx(pw, 0, SELECT_R);

    return true;
}